

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

ostream * __thiscall
inja::Environment::render_to(Environment *this,ostream *os,Template *tmpl,json *data)

{
  Renderer local_98;
  json *local_28;
  json *data_local;
  Template *tmpl_local;
  ostream *os_local;
  Environment *this_local;
  
  local_28 = data;
  data_local = (json *)tmpl;
  tmpl_local = (Template *)os;
  os_local = (ostream *)this;
  Renderer::Renderer(&local_98,&this->m_included_templates,&this->m_callbacks);
  Renderer::render_to(&local_98,(ostream *)tmpl_local,(Template *)data_local,local_28);
  Renderer::~Renderer(&local_98);
  return (ostream *)tmpl_local;
}

Assistant:

std::ostream& render_to(std::ostream& os, const Template& tmpl, const json& data) {
    Renderer(m_included_templates, m_callbacks).render_to(os, tmpl, data);
    return os;
  }